

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QTabBar::setTabEnabled(QTabBar *this,int index,bool enabled)

{
  uint uVar1;
  QTabBarPrivate *this_00;
  Tab *pTVar2;
  long lVar3;
  int index_00;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < (ulong)(this_00->tabList).d.size) &&
     (pTVar2 = (this_00->tabList).d.ptr[index], pTVar2 != (Tab *)0x0)) {
    pTVar2->field_0xe4 = pTVar2->field_0xe4 & 0xfe | enabled;
    QWidget::setShortcutEnabled(&this->super_QWidget,pTVar2->shortcutId,enabled);
    QWidget::update(&this->super_QWidget);
    uVar1 = this_00->currentIndex;
    if (enabled) {
      if ((((int)uVar1 < 0) ||
          (lVar3 = *(long *)&(this->super_QWidget).field_0x8,
          *(ulong *)(lVar3 + 0x2e8) <= (ulong)uVar1)) ||
         ((*(byte *)(*(long *)(*(long *)(lVar3 + 0x2e0) + (ulong)uVar1 * 8) + 0xe4) & 2) == 0)) {
LAB_0048be38:
        index_00 = QTabBarPrivate::selectNewCurrentIndexFrom(this_00,index);
        setCurrentIndex(this,index_00);
        return;
      }
    }
    else if (uVar1 == index) {
      index = index + 1;
      goto LAB_0048be38;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }